

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_tcp.cc
# Opt level: O3

void receive_vector<unsigned_int>
               (server<(connector::CONNECTOR_TYPE)0> *server,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  char *pcVar1;
  pointer puVar2;
  iterator __position;
  ostream *poVar3;
  uint uVar4;
  uint local_3c;
  uint local_38;
  uint32_t current_vec_size;
  uint element_memory;
  
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_3c = 0;
  uVar4 = 0;
  recv(server->_skt,&local_3c,4,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server_tcp.cc",0xd);
  local_38._0_1_ = 0x3a;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_38,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x21);
  local_38._0_1_ = 0x3a;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"receive_vector",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Got current vec_size: ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_38._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_38,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(vec,(ulong)local_3c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server_tcp.cc",0xd);
  local_38._0_1_ = 0x3a;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_38,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
  local_38 = CONCAT31(local_38._1_3_,0x3a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"receive_vector",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Receiving vector:\n",0x12);
  if (local_3c != 0) {
    pcVar1 = (char *)((long)&current_vec_size + 3);
    do {
      recv(server->_skt,&local_38,4,0);
      __position._M_current =
           (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)vec,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[CONNECTOR - ",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"server_tcp.cc",0xd);
      current_vec_size._3_1_ = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
      current_vec_size._3_1_ = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"receive_vector",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"()]: ",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    - ",6);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      current_vec_size._3_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_3c);
  }
  return;
}

Assistant:

void receive_vector(connector::server< connector::TCP > & server, std::vector< T > & vec)
{   
    // remove all elements from the vector
    vec.clear();
    // preallocate the size "member"
    uint32_t current_vec_size = 0;
    server.receive_tcp< uint32_t >( current_vec_size );
    DEBUG_MSG_CONNECTOR("Got current vec_size: " << current_vec_size << '\n');
    // preallocate space
    vec.reserve(current_vec_size);
    DEBUG_MSG_CONNECTOR("Receiving vector:\n");
    T element_memory;
    for ( uint32_t i = 0; i < current_vec_size; ++i )
    {
        server.receive_tcp< T >( element_memory );
        vec.emplace_back(element_memory);
        DEBUG_MSG_CONNECTOR("    - " << element_memory << '\n');
    }
}